

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::ArrayFeatureType::ByteSizeLong(ArrayFeatureType *this)

{
  uint32 uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  int value;
  
  sVar2 = google::protobuf::internal::WireFormatLite::Int64Size(&this->shape_);
  if (sVar2 == 0) {
    value = 0;
    lVar4 = 0;
  }
  else {
    value = (int)sVar2;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar4 = sVar3 + 1;
  }
  this->_shape_cached_byte_size_ = value;
  sVar2 = lVar4 + sVar2;
  if (this->datatype_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->datatype_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->_oneof_case_[0] == 0x1f) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ArrayFeatureType_ShapeRange>
                      ((this->ShapeFlexibility_).shaperange_);
  }
  else {
    if (this->_oneof_case_[0] != 0x15) goto LAB_004d528b;
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                      ((this->ShapeFlexibility_).enumeratedshapes_);
  }
  sVar2 = sVar2 + sVar3 + 2;
LAB_004d528b:
  uVar1 = this->_oneof_case_[1];
  if (uVar1 == 0x3d) {
    sVar2 = sVar2 + 10;
  }
  else if (uVar1 == 0x33) {
    sVar2 = sVar2 + 6;
  }
  else if (uVar1 == 0x29) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      ((this->defaultOptionalValue_).intdefaultvalue_);
    sVar2 = sVar2 + sVar3 + 2;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t ArrayFeatureType::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ArrayFeatureType)
  size_t total_size = 0;

  // repeated int64 shape = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      Int64Size(this->shape_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _shape_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->datatype() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->datatype());
  }

  switch (ShapeFlexibility_case()) {
    // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
    case kEnumeratedShapes: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.enumeratedshapes_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
    case kShapeRange: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ShapeFlexibility_.shaperange_);
      break;
    }
    case SHAPEFLEXIBILITY_NOT_SET: {
      break;
    }
  }
  switch (defaultOptionalValue_case()) {
    // int32 intDefaultValue = 41;
    case kIntDefaultValue: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->intdefaultvalue());
      break;
    }
    // float floatDefaultValue = 51;
    case kFloatDefaultValue: {
      total_size += 2 + 4;
      break;
    }
    // double doubleDefaultValue = 61;
    case kDoubleDefaultValue: {
      total_size += 2 + 8;
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}